

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::calendar_impl::calendar_impl(calendar_impl *this,cdata *dat)

{
  Calendar *pCVar1;
  uint in_EAX;
  Calendar *pCVar2;
  UErrorCode err;
  undefined8 uStack_28;
  
  (this->super_abstract_calendar)._vptr_abstract_calendar = (_func_int **)&PTR_clone_001daec8;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->encoding_)._M_dataplus._M_p = (pointer)&(this->encoding_).field_2;
  (this->encoding_)._M_string_length = 0;
  (this->encoding_).field_2._M_local_buf[0] = '\0';
  (this->calendar_).ptr_ = (Calendar *)0x0;
  uStack_28 = (ulong)in_EAX;
  pCVar2 = (Calendar *)
           icu_70::Calendar::createInstance(&dat->locale,(UErrorCode *)((long)&uStack_28 + 4));
  pCVar1 = (this->calendar_).ptr_;
  if (pCVar1 != (Calendar *)0x0) {
    (**(code **)(*(long *)pCVar1 + 8))();
  }
  (this->calendar_).ptr_ = pCVar2;
  check_and_throw_dt((UErrorCode *)((long)&uStack_28 + 4));
  std::__cxx11::string::_M_assign((string *)&this->encoding_);
  return;
}

Assistant:

calendar_impl(cdata const &dat)
        {
            UErrorCode err=U_ZERO_ERROR;
            calendar_.reset(icu::Calendar::createInstance(dat.locale,err));
            check_and_throw_dt(err);
            #if U_ICU_VERSION_MAJOR_NUM*100 + U_ICU_VERSION_MINOR_NUM < 402
            // workaround old/invalid data, it should be 4 in general
            calendar_->setMinimalDaysInFirstWeek(4);
            #endif
            encoding_ = dat.encoding;
        }